

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O1

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *first;
  undefined4 extraout_var;
  bool bVar7;
  byte *pbVar8;
  char *tok_buf;
  char value [256];
  char content [1024];
  CURLcode local_56c;
  byte *local_558;
  ulong local_550;
  char *local_548;
  char *local_540;
  char local_538 [256];
  char local_438 [1032];
  
  local_540 = digest->nonce;
  local_558 = (byte *)chlg;
  Curl_auth_digest_cleanup(digest);
  local_550 = 0;
  bVar7 = false;
  do {
    bVar2 = *local_558;
    pbVar8 = local_558;
    while ((bVar2 != 0 && (iVar4 = Curl_isspace((uint)bVar2), iVar4 != 0))) {
      bVar2 = pbVar8[1];
      pbVar8 = pbVar8 + 1;
    }
    local_558 = pbVar8;
    _Var3 = Curl_auth_digest_get_pair((char *)pbVar8,local_538,local_438,(char **)&local_558);
    iVar4 = 2;
    if (_Var3) {
      iVar4 = Curl_strcasecompare(local_538,"nonce");
      if (iVar4 != 0) {
        (*Curl_cfree)(digest->nonce);
        pcVar6 = (*Curl_cstrdup)(local_438);
        digest->nonce = pcVar6;
        goto LAB_00147e33;
      }
      iVar4 = Curl_strcasecompare(local_538,"stale");
      if (iVar4 != 0) {
        iVar4 = Curl_strcasecompare(local_438,"true");
        if (iVar4 != 0) {
          digest->field_0x3c = digest->field_0x3c | 1;
          digest->nc = 1;
        }
        goto LAB_00147e81;
      }
      iVar4 = Curl_strcasecompare(local_538,"realm");
      if (iVar4 == 0) {
        iVar4 = Curl_strcasecompare(local_538,"opaque");
        if (iVar4 != 0) {
          (*Curl_cfree)(digest->opaque);
          pcVar6 = (*Curl_cstrdup)(local_438);
          digest->opaque = pcVar6;
          goto LAB_00147e33;
        }
        iVar4 = Curl_strcasecompare(local_538,"qop");
        if (iVar4 != 0) {
          local_548 = (char *)0x0;
          pcVar6 = (*Curl_cstrdup)(local_438);
          if (pcVar6 == (char *)0x0) {
LAB_001480b7:
            bVar1 = false;
            local_56c = CURLE_OUT_OF_MEMORY;
          }
          else {
            first = strtok_r(pcVar6,",",&local_548);
            while (first != (char *)0x0) {
              iVar4 = Curl_strcasecompare(first,"auth");
              if (iVar4 == 0) {
                iVar4 = Curl_strcasecompare(first,"auth-int");
                if (iVar4 != 0) {
                  bVar7 = true;
                }
              }
              else {
                local_550 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
              }
              first = strtok_r((char *)0x0,",",&local_548);
            }
            (*Curl_cfree)(pcVar6);
            if ((local_550 & 1) == 0) {
              if (bVar7) {
                (*Curl_cfree)(digest->qop);
                pcVar6 = "auth-int";
                goto LAB_001480a1;
              }
            }
            else {
              (*Curl_cfree)(digest->qop);
              pcVar6 = "auth";
LAB_001480a1:
              pcVar6 = (*Curl_cstrdup)(pcVar6);
              digest->qop = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_001480b7;
            }
            bVar1 = true;
          }
          iVar4 = 1;
          if (!bVar1) goto LAB_00147ecf;
          goto LAB_00147e81;
        }
        iVar4 = Curl_strcasecompare(local_538,"algorithm");
        if (iVar4 == 0) {
          iVar4 = Curl_strcasecompare(local_538,"userhash");
          if ((iVar4 != 0) && (iVar4 = Curl_strcasecompare(local_438,"true"), iVar4 != 0)) {
            digest->field_0x3c = digest->field_0x3c | 2;
          }
          goto LAB_00147e81;
        }
        (*Curl_cfree)(digest->algorithm);
        pcVar6 = (*Curl_cstrdup)(local_438);
        digest->algorithm = pcVar6;
        iVar4 = 1;
        if (pcVar6 != (char *)0x0) {
          iVar5 = Curl_strcasecompare(local_438,"MD5-sess");
          if (iVar5 == 0) {
            iVar5 = Curl_strcasecompare(local_438,"MD5");
            if (iVar5 == 0) {
              iVar5 = Curl_strcasecompare(local_438,"SHA-256");
              if (iVar5 == 0) {
                iVar5 = Curl_strcasecompare(local_438,"SHA-256-SESS");
                if (iVar5 == 0) {
                  iVar5 = Curl_strcasecompare(local_438,"SHA-512-256");
                  if (iVar5 == 0) {
                    iVar5 = Curl_strcasecompare(local_438,"SHA-512-256-SESS");
                    if (iVar5 == 0) {
                      local_56c = CURLE_BAD_CONTENT_ENCODING;
                      goto LAB_00147ecf;
                    }
                    digest->algo = 5;
                  }
                  else {
                    digest->algo = 4;
                  }
                }
                else {
                  digest->algo = 3;
                }
              }
              else {
                digest->algo = 2;
              }
            }
            else {
              digest->algo = 0;
            }
          }
          else {
            digest->algo = 1;
          }
          goto LAB_00147e81;
        }
      }
      else {
        (*Curl_cfree)(digest->realm);
        pcVar6 = (*Curl_cstrdup)(local_438);
        digest->realm = pcVar6;
LAB_00147e33:
        if (pcVar6 != (char *)0x0) {
LAB_00147e81:
          bVar2 = *local_558;
          pbVar8 = local_558;
          while ((bVar2 != 0 && (iVar4 = Curl_isspace((uint)bVar2), iVar4 != 0))) {
            bVar2 = pbVar8[1];
            pbVar8 = pbVar8 + 1;
          }
          iVar4 = 0;
          local_558 = pbVar8;
          if (*pbVar8 == 0x2c) {
            local_558 = pbVar8 + 1;
          }
          goto LAB_00147ecf;
        }
      }
      iVar4 = 1;
      local_56c = CURLE_OUT_OF_MEMORY;
    }
LAB_00147ecf:
    if (iVar4 != 0) {
      if ((iVar4 == 2) &&
         (((local_540 == (char *)0x0 ||
           (local_56c = CURLE_BAD_CONTENT_ENCODING, (digest->field_0x3c & 1) != 0)) &&
          (local_56c = CURLE_BAD_CONTENT_ENCODING, digest->nonce != (char *)0x0)))) {
        local_56c = CURLE_OK;
      }
      return local_56c;
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        char *tok_buf = NULL;
        /* Tokenize the list and choose auth if possible, use a temporary
           clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else if(strcasecompare(content, "SHA-256"))
          digest->algo = CURLDIGESTALGO_SHA256;
        else if(strcasecompare(content, "SHA-256-SESS"))
          digest->algo = CURLDIGESTALGO_SHA256SESS;
        else if(strcasecompare(content, "SHA-512-256"))
          digest->algo = CURLDIGESTALGO_SHA512_256;
        else if(strcasecompare(content, "SHA-512-256-SESS"))
          digest->algo = CURLDIGESTALGO_SHA512_256SESS;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else if(strcasecompare(value, "userhash")) {
        if(strcasecompare(content, "true")) {
          digest->userhash = TRUE;
        }
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}